

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamplerTest.cpp
# Opt level: O2

void __thiscall
jaegertracing::samplers::Sampler_testProbabilisticSamplerInvalidRate_Test::TestBody
          (Sampler_testProbabilisticSamplerInvalidRate_Test *this)

{
  char cVar1;
  allocator local_130 [15];
  allocator local_121;
  unique_ptr<jaegertracing::metrics::Metrics,_std::default_delete<jaegertracing::metrics::Metrics>_>
  metrics;
  string local_118;
  undefined1 local_f0 [8];
  string local_e8;
  Config samplerConfig2;
  Config samplerConfig1;
  
  std::__cxx11::string::string((string *)&samplerConfig2,"probabilistic",(allocator *)&metrics);
  std::__cxx11::string::string((string *)&local_118,"",local_130);
  local_e8._M_dataplus._M_p = (pointer)0x0;
  Config::Config(&samplerConfig1,&samplerConfig2._type,1.1,&local_118,0,(duration *)(local_f0 + 8));
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&samplerConfig2);
  std::__cxx11::string::string((string *)&local_118,"probabilistic",local_130);
  std::__cxx11::string::string((string *)(local_f0 + 8),"",&local_121);
  metrics._M_t.
  super___uniq_ptr_impl<jaegertracing::metrics::Metrics,_std::default_delete<jaegertracing::metrics::Metrics>_>
  ._M_t.
  super__Tuple_impl<0UL,_jaegertracing::metrics::Metrics_*,_std::default_delete<jaegertracing::metrics::Metrics>_>
  .super__Head_base<0UL,_jaegertracing::metrics::Metrics_*,_false>._M_head_impl =
       (__uniq_ptr_data<jaegertracing::metrics::Metrics,_std::default_delete<jaegertracing::metrics::Metrics>,_true,_true>
        )(__uniq_ptr_impl<jaegertracing::metrics::Metrics,_std::default_delete<jaegertracing::metrics::Metrics>_>
          )0x0;
  Config::Config(&samplerConfig2,&local_118,-0.1,(string *)(local_f0 + 8),0,(duration *)&metrics);
  std::__cxx11::string::~string((string *)(local_f0 + 8));
  std::__cxx11::string::~string((string *)&local_118);
  jaegertracing::logging::nullLogger();
  jaegertracing::metrics::Metrics::makeNullMetrics();
  cVar1 = testing::internal::AlwaysTrue();
  if (cVar1 != '\0') {
    std::__cxx11::string::string((string *)&local_118,"test-service",local_130);
    Config::makeSampler((Config *)local_f0,&samplerConfig1._type,(Logger *)&local_118,
                        (Metrics *)local_e8._M_dataplus._M_p);
    if (local_f0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_f0 + 8))();
    }
    local_f0 = (undefined1  [8])0x0;
    std::__cxx11::string::~string((string *)&local_118);
  }
  testing::Message::Message((Message *)&local_118);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_130,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/SamplerTest.cpp"
             ,0xac,
             "Expected: samplerConfig1.makeSampler(\"test-service\", *logger, *metrics) throws an exception of type std::invalid_argument.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)local_130,(Message *)&local_118);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_130);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_118);
  std::
  unique_ptr<jaegertracing::metrics::Metrics,_std::default_delete<jaegertracing::metrics::Metrics>_>
  ::~unique_ptr(&metrics);
  if ((Metrics *)local_e8._M_dataplus._M_p != (Metrics *)0x0) {
    (**(code **)((long)(((unique_ptr<jaegertracing::metrics::Counter,_std::default_delete<jaegertracing::metrics::Counter>_>
                          *)local_e8._M_dataplus._M_p)->_M_t).
                       super___uniq_ptr_impl<jaegertracing::metrics::Counter,_std::default_delete<jaegertracing::metrics::Counter>_>
                       ._M_t + 8))();
  }
  Config::~Config(&samplerConfig2);
  Config::~Config(&samplerConfig1);
  return;
}

Assistant:

TEST(Sampler, testProbabilisticSamplerInvalidRate)
{
    Config samplerConfig1(kSamplerTypeProbabilistic,
                          1.1,
                          "",
                          0,
                          samplers::Config::Clock::duration());
    Config samplerConfig2(kSamplerTypeProbabilistic,
                          -0.1,
                          "",
                          0,
                          samplers::Config::Clock::duration());
    auto logger = logging::nullLogger();
    auto metrics = metrics::Metrics::makeNullMetrics();
    ASSERT_THROW(samplerConfig1.makeSampler("test-service", *logger, *metrics),
                 std::invalid_argument);
    ASSERT_THROW(samplerConfig2.makeSampler("test-service", *logger, *metrics),
                 std::invalid_argument);
}